

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.cpp
# Opt level: O2

string * __thiscall pbrt::XYZ::ToString_abi_cxx11_(string *__return_storage_ptr__,XYZ *this)

{
  float *in_R9;
  
  StringPrintf<float_const&,float_const&,float_const&>
            (__return_storage_ptr__,(pbrt *)"[ %f %f %f ]",(char *)this,&this->Y,&this->Z,in_R9);
  return __return_storage_ptr__;
}

Assistant:

std::string XYZ::ToString() const {
    return StringPrintf("[ %f %f %f ]", X, Y, Z);
}